

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O0

void test17(char *infile,char *password,char *outfile,char *xarg)

{
  char *xarg_local;
  char *outfile_local;
  char *password_local;
  char *infile_local;
  
  qpdf_read(qpdf,infile,password);
  qpdf_init_write(qpdf,outfile);
  qpdf_set_static_ID(qpdf,1);
  qpdf_set_static_aes_IV(qpdf,1);
  qpdf_set_r5_encryption_parameters2(qpdf,"user3","owner3",1,1,1,1,1,1,1,1);
  qpdf_write(qpdf);
  report_errors();
  return;
}

Assistant:

static void
test17(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    qpdf_read(qpdf, infile, password);
    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_set_static_aes_IV(qpdf, QPDF_TRUE);
    qpdf_set_r5_encryption_parameters2(
        qpdf,
        "user3",
        "owner3",
        QPDF_TRUE,
        QPDF_TRUE,
        QPDF_TRUE,
        QPDF_TRUE,
        QPDF_TRUE,
        QPDF_TRUE,
        qpdf_r3p_low,
        QPDF_TRUE);
    qpdf_write(qpdf);
    report_errors();
}